

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcHieNew.c
# Opt level: O1

void Au_ManReorderModels_rec(Au_Ntk_t *pNtk,Vec_Int_t *vOrder)

{
  void *pvVar1;
  ulong uVar2;
  long lVar3;
  Au_Ntk_t *pNtk_00;
  uint uVar4;
  ulong uVar5;
  long lVar6;
  
  if (pNtk->fMark != 0) {
    return;
  }
  pNtk->fMark = 1;
  if (0 < (pNtk->vObjs).nSize) {
    lVar6 = 0;
    do {
      if ((pNtk->vObjs).nSize <= lVar6) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      uVar4 = (pNtk->vObjs).pArray[lVar6];
      pvVar1 = (pNtk->vPages).pArray[(int)uVar4 >> 0xc];
      uVar5 = (ulong)((uVar4 & 0xfff) << 4);
      uVar2 = *(ulong *)((long)pvVar1 + uVar5);
      if ((uVar2 & 0x700000000) == 0x600000000) {
        lVar3 = *(long *)(*(long *)((long)pvVar1 + uVar5 & 0xfffffffffffffc00) + 8);
        uVar4 = (uint)uVar2;
        if (*(int *)(lVar3 + 0xc) <= (int)(uVar4 & 0x3fffffff)) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecPtr.h"
                        ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
        }
        pNtk_00 = *(Au_Ntk_t **)(*(long *)(lVar3 + 0x10) + (ulong)(uVar4 & 0x3fffffff) * 8);
        if (pNtk_00 != pNtk && pNtk_00 != (Au_Ntk_t *)0x0) {
          Au_ManReorderModels_rec(pNtk_00,vOrder);
        }
      }
      lVar6 = lVar6 + 1;
    } while (lVar6 < (pNtk->vObjs).nSize);
  }
  Vec_IntPush(vOrder,pNtk->Id);
  return;
}

Assistant:

void Au_ManReorderModels_rec( Au_Ntk_t * pNtk, Vec_Int_t * vOrder )
{
    Au_Ntk_t * pBoxModel;
    Au_Obj_t * pObj;
    int k;
    if ( pNtk->fMark )
        return;
    pNtk->fMark = 1;
    Au_NtkForEachBox( pNtk, pObj, k )
    {
        pBoxModel = Au_ObjModel(pObj);
        if ( pBoxModel == NULL || pBoxModel == pNtk )
            continue;
        Au_ManReorderModels_rec( pBoxModel, vOrder );
    }
    Vec_IntPush( vOrder, pNtk->Id );
}